

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  string *local_90;
  string *absl_log_internal_check_op_result_2;
  undefined8 local_80;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  string *local_60;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_48 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  CopyingOutputStreamAdaptor *pCStack_10;
  int count_local;
  CopyingOutputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pCStack_10 = this;
  if (count == 0) {
    Flush(this);
  }
  else {
    iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(count);
    iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
    local_20 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"count >= 0");
    if (local_20 != (string *)0x0) {
      local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13c,local_48._0_8_,local_48._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
    }
    iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->buffer_used_);
    iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->buffer_size_);
    local_60 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (iVar1,iVar2,"buffer_used_ == buffer_size_");
    if (local_60 != (string *)0x0) {
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
      local_80 = auVar4._8_8_;
      absl_log_internal_check_op_result_2 = auVar4._0_8_;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13d,absl_log_internal_check_op_result_2,local_80);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [43])" BackUp() can only be called after Next().");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
    }
    iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                      (absl_log_internal_check_op_result._4_4_);
    iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->buffer_used_);
    local_90 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                         (iVar1,iVar2,"count <= buffer_used_");
    if (local_90 != (string *)0x0) {
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13f,auVar4._0_8_,auVar4._8_8_);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [78])
                                 " Can\'t back up over more bytes than were returned by the last call to Next()."
                         );
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
    }
    this->buffer_used_ = this->buffer_used_ - absl_log_internal_check_op_result._4_4_;
  }
  return;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}